

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::AST_Node>
chaiscript::
make_shared<chaiscript::AST_Node,chaiscript::eval::Prefix_AST_Node,std::__cxx11::string,chaiscript::Parse_Location,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          Parse_Location *arg_1,
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          *arg_2)

{
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::AST_Node> sVar1;
  AST_Node *in_stack_ffffffffffffff38;
  element_type *this_00;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_stack_ffffffffffffffa8;
  Parse_Location *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Prefix_AST_Node *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  this = (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          *)operator_new(0x98);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
  Parse_Location::Parse_Location
            ((Parse_Location *)this_00,(Parse_Location *)in_stack_ffffffffffffff38);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)this_00,
           (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)in_stack_ffffffffffffff38);
  eval::Prefix_AST_Node::Prefix_AST_Node
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr<chaiscript::AST_Node,void>
            ((shared_ptr<chaiscript::AST_Node> *)this_00,in_stack_ffffffffffffff38);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(this);
  Parse_Location::~Parse_Location((Parse_Location *)0x25aada);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<chaiscript::AST_Node>)
         sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }